

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_fmax_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  float_status *status_00;
  int32_t *piVar1;
  byte bVar2;
  int iVar3;
  float32 fVar4;
  uint uVar5;
  uint uVar6;
  float32 fVar7;
  float32 fVar8;
  uint uVar9;
  float64 fVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  fpr_t *pfVar14;
  float64 fVar15;
  fpr_t *pfVar16;
  float_status *status;
  float_status *status_6;
  uint32_t unaff_retaddr;
  
  status_00 = &(env->active_tc).msa_fp_status;
  pfVar14 = (env->active_fpu).fpr + ws;
  pfVar16 = (env->active_fpu).fpr + wt;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 3) {
    uVar12 = pfVar14->fd;
    if ((uVar12 & 0x7fffffffffffffff) < 0x7ff0000000000001) {
      iVar3 = float64_is_quiet_nan_mips(pfVar16->fd,status_00);
      uVar12 = pfVar14->fd;
      if (iVar3 == 0) goto LAB_0076fd81;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
LAB_0076fdb5:
      fVar10 = float64_max_mips(uVar12,uVar12,status_00);
      bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar5 = ieee_ex_to_mips_mips((uint)bVar2);
      uVar11 = (env->active_tc).msacsr;
      uVar9 = (uint)(byte)((byte)((uVar11 & 0x1000000) >> 0x18) & bVar2 >> 6);
      uVar13 = 3;
      if ((uVar11 & 0x1000000) == 0) {
        uVar13 = uVar9;
      }
      if (-1 < (char)bVar2) {
        uVar13 = uVar9;
      }
      uVar13 = uVar13 | uVar5;
      uVar9 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
      uVar6 = uVar9 | uVar13;
      uVar5 = uVar5 & 0xfffffffc;
      if ((uVar9 != 0 || (uVar13 & 1) != 0) || (uVar11 & 0x100) != 0) {
        uVar5 = uVar6;
      }
      if ((uVar13 & 2) == 0) {
        uVar5 = uVar6;
      }
      if ((uVar5 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
        uVar13 = uVar5 << 0xc;
LAB_0076fe72:
        (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar11;
        uVar11 = (uVar11 >> 7 & 0x1f | 0x20) & uVar5;
        goto joined_r0x0076ff92;
      }
      if ((uVar11 >> 0x12 & 1) == 0) {
        uVar13 = uVar5 << 0xc | uVar11;
        uVar11 = uVar11 & 0xfff80fff;
        goto LAB_0076fe72;
      }
LAB_0076ff9b:
      fVar10 = float64_default_nan_mips(status_00);
      fVar10 = (long)(int)uVar5 | fVar10 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    else {
LAB_0076fd81:
      fVar10 = pfVar16->fd;
      if ((fVar10 & 0x7fffffffffffffff) < 0x7ff0000000000001) {
        iVar3 = float64_is_quiet_nan_mips(uVar12,status_00);
        if (iVar3 != 0) {
          (env->active_tc).msa_fp_status.float_exception_flags = '\0';
          uVar12 = pfVar16->fd;
          goto LAB_0076fdb5;
        }
        uVar12 = pfVar14->fd;
        fVar10 = pfVar16->fd;
      }
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar10 = float64_max_mips(uVar12,fVar10,status_00);
      bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar5 = ieee_ex_to_mips_mips((uint)bVar2);
      uVar11 = (env->active_tc).msacsr;
      uVar9 = (uint)(byte)((byte)((uVar11 & 0x1000000) >> 0x18) & bVar2 >> 6);
      uVar13 = 3;
      if ((uVar11 & 0x1000000) == 0) {
        uVar13 = uVar9;
      }
      if (-1 < (char)bVar2) {
        uVar13 = uVar9;
      }
      uVar13 = uVar13 | uVar5;
      uVar6 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
      uVar9 = uVar6 | uVar13;
      uVar5 = uVar5 & 0xfffffffc;
      if ((uVar6 != 0 || (uVar13 & 1) != 0) || (uVar11 & 0x100) != 0) {
        uVar5 = uVar9;
      }
      if ((uVar13 & 2) == 0) {
        uVar5 = uVar9;
      }
      if ((uVar5 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
        uVar13 = uVar5 << 0xc;
      }
      else {
        if ((uVar11 >> 0x12 & 1) != 0) goto LAB_0076ff9b;
        uVar13 = uVar5 << 0xc | uVar11;
        uVar11 = uVar11 & 0xfff80fff;
      }
      (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar11;
      uVar11 = (uVar11 >> 7 & 0x1f | 0x20) & uVar5;
joined_r0x0076ff92:
      if (uVar11 != 0) goto LAB_0076ff9b;
    }
    fVar15 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    if ((fVar15 & 0x7fffffffffffffff) < 0x7ff0000000000001) {
      iVar3 = float64_is_quiet_nan_mips
                        (*(float64 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8),status_00)
      ;
      uVar12 = *(float64 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
      fVar15 = uVar12;
      if (iVar3 == 0) goto LAB_00770001;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    }
    else {
LAB_00770001:
      uVar12 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
      if ((uVar12 & 0x7fffffffffffffff) < 0x7ff0000000000001) {
        iVar3 = float64_is_quiet_nan_mips(fVar15,status_00);
        if (iVar3 != 0) {
          (env->active_tc).msa_fp_status.float_exception_flags = '\0';
          uVar12 = *(float64 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
          fVar15 = uVar12;
          goto LAB_00770039;
        }
        fVar15 = *(float64 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
        uVar12 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
      }
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    }
LAB_00770039:
    fVar15 = float64_max_mips(fVar15,uVar12,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar5 = ieee_ex_to_mips_mips((uint)bVar2);
    uVar11 = (env->active_tc).msacsr;
    uVar9 = (uint)(byte)((byte)((uVar11 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar13 = 3;
    if ((uVar11 & 0x1000000) == 0) {
      uVar13 = uVar9;
    }
    if (-1 < (char)bVar2) {
      uVar13 = uVar9;
    }
    uVar13 = uVar13 | uVar5;
    uVar6 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
    uVar9 = uVar6 | uVar13;
    uVar5 = uVar5 & 0xfffffffc;
    if ((uVar6 != 0 || (uVar13 & 1) != 0) || (uVar11 & 0x100) != 0) {
      uVar5 = uVar9;
    }
    if ((uVar13 & 2) == 0) {
      uVar5 = uVar9;
    }
    if ((uVar5 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
      uVar13 = uVar5 << 0xc;
LAB_007700e8:
      (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar11;
      if (((uVar11 >> 7 & 0x1f | 0x20) & uVar5) == 0) goto LAB_0077074b;
    }
    else if ((uVar11 >> 0x12 & 1) == 0) {
      uVar13 = uVar5 << 0xc | uVar11;
      uVar11 = uVar11 & 0xfff80fff;
      goto LAB_007700e8;
    }
    fVar15 = float64_default_nan_mips(status_00);
    fVar15 = (long)(int)uVar5 | fVar15 & 0xffffffffffffffc0 ^ 0x8000000000000;
    goto LAB_0077074b;
  }
  if (df != 2) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x1abd,
                  "void helper_msa_fmax_df_mips(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  uVar11 = pfVar14->fs[0];
  if ((uVar11 & 0x7fffffff) < 0x7f800001) {
    iVar3 = float32_is_quiet_nan_mips(pfVar16->fs[0],status_00);
    uVar11 = pfVar14->fs[0];
    if (iVar3 == 0) goto LAB_0076fd3f;
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    uVar13 = uVar11;
  }
  else {
LAB_0076fd3f:
    uVar13 = pfVar16->fs[0];
    if ((uVar13 & 0x7fffffff) < 0x7f800001) {
      iVar3 = float32_is_quiet_nan_mips(uVar11,status_00);
      if (iVar3 != 0) {
        (env->active_tc).msa_fp_status.float_exception_flags = '\0';
        uVar11 = pfVar16->fs[0];
        uVar13 = uVar11;
        goto LAB_0077013a;
      }
      uVar11 = pfVar14->fs[0];
      uVar13 = pfVar16->fs[0];
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  }
LAB_0077013a:
  fVar4 = float32_max_mips(uVar11,uVar13,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar5 = ieee_ex_to_mips_mips((uint)bVar2);
  uVar11 = (env->active_tc).msacsr;
  uVar9 = (uint)(byte)((byte)((uVar11 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar13 = 3;
  if ((uVar11 & 0x1000000) == 0) {
    uVar13 = uVar9;
  }
  if (-1 < (char)bVar2) {
    uVar13 = uVar9;
  }
  uVar13 = uVar13 | uVar5;
  uVar9 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
  uVar6 = uVar9 | uVar13;
  uVar5 = uVar5 & 0xfffffffc;
  if ((uVar9 != 0 || (uVar13 & 1) != 0) || (uVar11 & 0x100) != 0) {
    uVar5 = uVar6;
  }
  if ((uVar13 & 2) == 0) {
    uVar5 = uVar6;
  }
  if ((uVar5 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
    uVar13 = uVar5 << 0xc;
LAB_007701e9:
    (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar11;
    if (((uVar11 >> 7 & 0x1f | 0x20) & uVar5) != 0) goto LAB_00770204;
  }
  else {
    if ((uVar11 >> 0x12 & 1) == 0) {
      uVar13 = uVar5 << 0xc | uVar11;
      uVar11 = uVar11 & 0xfff80fff;
      goto LAB_007701e9;
    }
LAB_00770204:
    fVar4 = float32_default_nan_mips(status_00);
    fVar4 = fVar4 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  uVar11 = *(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  if ((uVar11 & 0x7fffffff) < 0x7f800001) {
    iVar3 = float32_is_quiet_nan_mips
                      (*(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4),status_00);
    uVar11 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
    if (iVar3 == 0) goto LAB_00770259;
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    uVar13 = uVar11;
  }
  else {
LAB_00770259:
    uVar13 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    if ((uVar13 & 0x7fffffff) < 0x7f800001) {
      iVar3 = float32_is_quiet_nan_mips(uVar11,status_00);
      if (iVar3 != 0) {
        (env->active_tc).msa_fp_status.float_exception_flags = '\0';
        uVar11 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
        uVar13 = uVar11;
        goto LAB_00770295;
      }
      uVar11 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
      uVar13 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  }
LAB_00770295:
  fVar7 = float32_max_mips(uVar11,uVar13,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar5 = ieee_ex_to_mips_mips((uint)bVar2);
  uVar11 = (env->active_tc).msacsr;
  uVar9 = (uint)(byte)((byte)((uVar11 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar13 = 3;
  if ((uVar11 & 0x1000000) == 0) {
    uVar13 = uVar9;
  }
  if (-1 < (char)bVar2) {
    uVar13 = uVar9;
  }
  uVar13 = uVar13 | uVar5;
  uVar9 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
  uVar6 = uVar9 | uVar13;
  uVar5 = uVar5 & 0xfffffffc;
  if ((uVar9 != 0 || (uVar13 & 1) != 0) || (uVar11 & 0x100) != 0) {
    uVar5 = uVar6;
  }
  if ((uVar13 & 2) == 0) {
    uVar5 = uVar6;
  }
  if ((uVar5 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
    uVar13 = uVar5 << 0xc;
LAB_00770344:
    (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar11;
    if (((uVar11 >> 7 & 0x1f | 0x20) & uVar5) != 0) goto LAB_0077035f;
  }
  else {
    if ((uVar11 >> 0x12 & 1) == 0) {
      uVar13 = uVar5 << 0xc | uVar11;
      uVar11 = uVar11 & 0xfff80fff;
      goto LAB_00770344;
    }
LAB_0077035f:
    fVar7 = float32_default_nan_mips(status_00);
    fVar7 = fVar7 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  uVar11 = *(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  if ((uVar11 & 0x7fffffff) < 0x7f800001) {
    iVar3 = float32_is_quiet_nan_mips
                      (*(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8),status_00);
    uVar11 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    if (iVar3 == 0) goto LAB_007703bb;
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    uVar13 = uVar11;
  }
  else {
LAB_007703bb:
    uVar13 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    if ((uVar13 & 0x7fffffff) < 0x7f800001) {
      iVar3 = float32_is_quiet_nan_mips(uVar11,status_00);
      if (iVar3 != 0) {
        (env->active_tc).msa_fp_status.float_exception_flags = '\0';
        uVar11 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
        uVar13 = uVar11;
        goto LAB_007703f8;
      }
      uVar11 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
      uVar13 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
  }
LAB_007703f8:
  fVar8 = float32_max_mips(uVar11,uVar13,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar5 = ieee_ex_to_mips_mips((uint)bVar2);
  uVar11 = (env->active_tc).msacsr;
  uVar9 = (uint)(byte)((byte)((uVar11 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar13 = 3;
  if ((uVar11 & 0x1000000) == 0) {
    uVar13 = uVar9;
  }
  if (-1 < (char)bVar2) {
    uVar13 = uVar9;
  }
  uVar13 = uVar13 | uVar5;
  uVar6 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
  uVar9 = uVar6 | uVar13;
  uVar5 = uVar5 & 0xfffffffc;
  if ((uVar6 != 0 || (uVar13 & 1) != 0) || (uVar11 & 0x100) != 0) {
    uVar5 = uVar9;
  }
  if ((uVar13 & 2) == 0) {
    uVar5 = uVar9;
  }
  if ((uVar5 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
    uVar13 = uVar5 << 0xc;
LAB_007704a7:
    (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar11;
    if (((uVar11 >> 7 & 0x1f | 0x20) & uVar5) != 0) goto LAB_007704c2;
  }
  else {
    if ((uVar11 >> 0x12 & 1) == 0) {
      uVar13 = uVar5 << 0xc | uVar11;
      uVar11 = uVar11 & 0xfff80fff;
      goto LAB_007704a7;
    }
LAB_007704c2:
    fVar8 = float32_default_nan_mips(status_00);
    fVar8 = fVar8 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  fVar10 = CONCAT44(fVar7,fVar4);
  uVar11 = *(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  if ((uVar11 & 0x7fffffff) < 0x7f800001) {
    iVar3 = float32_is_quiet_nan_mips
                      (*(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc),status_00)
    ;
    uVar11 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
    if (iVar3 == 0) goto LAB_0077052f;
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
LAB_00770560:
    fVar4 = float32_max_mips(uVar11,uVar11,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar5 = ieee_ex_to_mips_mips((uint)bVar2);
    uVar11 = (env->active_tc).msacsr;
    uVar9 = (uint)(byte)((byte)((uVar11 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar13 = 3;
    if ((uVar11 & 0x1000000) == 0) {
      uVar13 = uVar9;
    }
    if (-1 < (char)bVar2) {
      uVar13 = uVar9;
    }
    uVar13 = uVar13 | uVar5;
    uVar9 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
    uVar6 = uVar9 | uVar13;
    uVar5 = uVar5 & 0xfffffffc;
    if ((uVar9 != 0 || (uVar13 & 1) != 0) || (uVar11 & 0x100) != 0) {
      uVar5 = uVar6;
    }
    if ((uVar13 & 2) == 0) {
      uVar5 = uVar6;
    }
    if ((uVar5 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
      uVar13 = uVar5 << 0xc;
LAB_00770620:
      (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar11;
      uVar11 = (uVar11 >> 7 & 0x1f | 0x20) & uVar5;
      goto joined_r0x00770727;
    }
    if ((uVar11 >> 0x12 & 1) == 0) {
      uVar13 = uVar5 << 0xc | uVar11;
      uVar11 = uVar11 & 0xfff80fff;
      goto LAB_00770620;
    }
LAB_0077072c:
    fVar4 = float32_default_nan_mips(status_00);
    fVar4 = fVar4 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  else {
LAB_0077052f:
    uVar13 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
    if ((uVar13 & 0x7fffffff) < 0x7f800001) {
      iVar3 = float32_is_quiet_nan_mips(uVar11,status_00);
      if (iVar3 != 0) {
        (env->active_tc).msa_fp_status.float_exception_flags = '\0';
        uVar11 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
        goto LAB_00770560;
      }
      uVar11 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
      uVar13 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar4 = float32_max_mips(uVar11,uVar13,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar5 = ieee_ex_to_mips_mips((uint)bVar2);
    uVar11 = (env->active_tc).msacsr;
    uVar9 = (uint)(byte)((byte)((uVar11 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar13 = 3;
    if ((uVar11 & 0x1000000) == 0) {
      uVar13 = uVar9;
    }
    if (-1 < (char)bVar2) {
      uVar13 = uVar9;
    }
    uVar13 = uVar13 | uVar5;
    uVar6 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
    uVar9 = uVar6 | uVar13;
    uVar5 = uVar5 & 0xfffffffc;
    if ((uVar6 != 0 || (uVar13 & 1) != 0) || (uVar11 & 0x100) != 0) {
      uVar5 = uVar9;
    }
    if ((uVar13 & 2) == 0) {
      uVar5 = uVar9;
    }
    if ((uVar5 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
      uVar13 = uVar5 << 0xc;
    }
    else {
      if ((uVar11 >> 0x12 & 1) != 0) goto LAB_0077072c;
      uVar13 = uVar5 << 0xc | uVar11;
      uVar11 = uVar11 & 0xfff80fff;
    }
    (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar11;
    uVar11 = (uVar11 >> 7 & 0x1f | 0x20) & uVar5;
joined_r0x00770727:
    if (uVar11 != 0) goto LAB_0077072c;
  }
  fVar15 = CONCAT44(fVar4,fVar8);
LAB_0077074b:
  uVar11 = (env->active_tc).msacsr;
  uVar13 = uVar11 >> 7 & 0x1f | 0x20;
  if ((uVar13 & uVar11 >> 0xc) == 0) {
    (env->active_tc).msacsr = (uVar11 >> 0xc & 0x1f) << 2 | uVar11;
    (env->active_fpu).fpr[wd].fd = fVar10;
    *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = fVar15;
    return;
  }
  do_raise_exception(env,unaff_retaddr,(ulong)uVar13);
}

Assistant:

void helper_msa_fmax_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
     float_status *status = &env->active_tc.msa_fp_status;
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    clear_msacsr_cause(env);

    if (df == DF_WORD) {

        if (NUMBER_QNAN_PAIR(pws->w[0], pwt->w[0], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[0], max, pws->w[0], pws->w[0], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[0], pws->w[0], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[0], max, pwt->w[0], pwt->w[0], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[0], max, pws->w[0], pwt->w[0], 32);
        }

        if (NUMBER_QNAN_PAIR(pws->w[1], pwt->w[1], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[1], max, pws->w[1], pws->w[1], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[1], pws->w[1], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[1], max, pwt->w[1], pwt->w[1], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[1], max, pws->w[1], pwt->w[1], 32);
        }

        if (NUMBER_QNAN_PAIR(pws->w[2], pwt->w[2], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[2], max, pws->w[2], pws->w[2], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[2], pws->w[2], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[2], max, pwt->w[2], pwt->w[2], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[2], max, pws->w[2], pwt->w[2], 32);
        }

        if (NUMBER_QNAN_PAIR(pws->w[3], pwt->w[3], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[3], max, pws->w[3], pws->w[3], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[3], pws->w[3], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[3], max, pwt->w[3], pwt->w[3], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[3], max, pws->w[3], pwt->w[3], 32);
        }

    } else if (df == DF_DOUBLE) {

        if (NUMBER_QNAN_PAIR(pws->d[0], pwt->d[0], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[0], max, pws->d[0], pws->d[0], 64);
        } else if (NUMBER_QNAN_PAIR(pwt->d[0], pws->d[0], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[0], max, pwt->d[0], pwt->d[0], 64);
        } else {
            MSA_FLOAT_MAXOP(pwx->d[0], max, pws->d[0], pwt->d[0], 64);
        }

        if (NUMBER_QNAN_PAIR(pws->d[1], pwt->d[1], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[1], max, pws->d[1], pws->d[1], 64);
        } else if (NUMBER_QNAN_PAIR(pwt->d[1], pws->d[1], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[1], max, pwt->d[1], pwt->d[1], 64);
        } else {
            MSA_FLOAT_MAXOP(pwx->d[1], max, pws->d[1], pwt->d[1], 64);
        }

    } else {

        assert(0);

    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}